

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O0

void __thiscall ADL_JavaOPL3::OPL3::updateChannelPans(OPL3 *this)

{
  int iVar1;
  int local_18;
  int baseAddress;
  int i;
  int array;
  OPL3 *this_local;
  
  for (baseAddress = 0; baseAddress < 2; baseAddress = baseAddress + 1) {
    for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
      iVar1 = this->channels[baseAddress][local_18]->channelBaseAddress + 0xc0;
      this->registers[iVar1] = this->registers[iVar1] | 0xf0;
      Channel::updatePan(this->channels[baseAddress][local_18],this);
    }
  }
  return;
}

Assistant:

void OPL3::updateChannelPans() {
    for(int array=0; array<2; array++)
        for(int i=0; i<9; i++) {
            int baseAddress = channels[array][i]->channelBaseAddress;
			registers[baseAddress+ChannelData::CHD1_CHC1_CHB1_CHA1_FB3_CNT1_Offset] |= 0xF0;
            channels[array][i]->updatePan(this);
        }

}